

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall V2Transport::ProcessReceivedKeyBytes(V2Transport *this)

{
  long lVar1;
  undefined8 uVar2;
  Span<std::byte> output;
  bool bVar3;
  pointer puVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_std::byte> ellswift_00;
  string_view source_file;
  Span<const_std::byte> aad;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock47;
  EllSwiftPubKey ellswift;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar5 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0xf < (ulong)((long)puVar4 - (long)pbVar5) && this->m_initiating == false) {
    bVar3 = std::__equal<true>::equal<unsigned_char>
                      (ProcessReceivedKeyBytes::MATCH._M_elems,"\x01",pbVar5 + 4);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(NET,Debug);
      if (bVar3) {
        s.m_size = 4;
        s.m_data = (this->m_recv_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_((string *)&ellswift,s);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "ProcessReceivedKeyBytes";
        logging_function._M_len = 0x17;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x453,NET,Debug,(ConstevalFormatString<1U>)0xc98832,
                   (string *)&ellswift);
        std::__cxx11::string::~string((string *)&ellswift);
      }
      bVar3 = false;
      goto LAB_0070b79a;
    }
    pbVar5 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar3 = true;
  if ((long)puVar4 - (long)pbVar5 == 0x40) {
    ellswift_00.m_size = 0x40;
    ellswift_00.m_data = pbVar5;
    EllSwiftPubKey::EllSwiftPubKey(&ellswift,ellswift_00);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock47,&this->m_send_mutex,"m_send_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0x45e,false);
    BIP324Cipher::Initialize(&this->m_cipher,&ellswift,this->m_initiating,false);
    this->m_recv_state = GARB_GARBTERM;
    puVar4 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar4) {
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    this->m_send_state = READY;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_send_buffer,
               (size_type)
               ((this->m_send_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)(this->m_send_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    puVar4 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar2 = *(undefined8 *)((this->m_cipher).m_send_garbage_terminator._M_elems + 8);
    *(undefined8 *)(puVar4 + -0x10) =
         *(undefined8 *)(this->m_cipher).m_send_garbage_terminator._M_elems;
    *(undefined8 *)(puVar4 + -8) = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_send_buffer,
               (size_type)
               ((this->m_send_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x14 - (long)(this->m_send_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    pbVar5 = (this->m_send_garbage).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    aad.m_size = (long)(this->m_send_garbage).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pbVar5;
    output.m_size = 0x14;
    output.m_data =
         (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + -0x14;
    aad.m_data = pbVar5;
    BIP324Cipher::Encrypt(&this->m_cipher,(Span<const_std::byte>)ZEXT816(0),aad,false,output);
    ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->m_send_garbage);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock47.super_unique_lock);
  }
LAB_0070b79a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ProcessReceivedKeyBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    AssertLockNotHeld(m_send_mutex);
    Assume(m_recv_state == RecvState::KEY);
    Assume(m_recv_buffer.size() <= EllSwiftPubKey::size());

    // As a special exception, if bytes 4-16 of the key on a responder connection match the
    // corresponding bytes of a V1 version message, but bytes 0-4 don't match the network magic
    // (if they did, we'd have switched to V1 state already), assume this is a peer from
    // another network, and disconnect them. They will almost certainly disconnect us too when
    // they receive our uniformly random key and garbage, but detecting this case specially
    // means we can log it.
    static constexpr std::array<uint8_t, 12> MATCH = {'v', 'e', 'r', 's', 'i', 'o', 'n', 0, 0, 0, 0, 0};
    static constexpr size_t OFFSET = std::tuple_size_v<MessageStartChars>;
    if (!m_initiating && m_recv_buffer.size() >= OFFSET + MATCH.size()) {
        if (std::equal(MATCH.begin(), MATCH.end(), m_recv_buffer.begin() + OFFSET)) {
            LogDebug(BCLog::NET, "V2 transport error: V1 peer with wrong MessageStart %s\n",
                     HexStr(Span(m_recv_buffer).first(OFFSET)));
            return false;
        }
    }

    if (m_recv_buffer.size() == EllSwiftPubKey::size()) {
        // Other side's key has been fully received, and can now be Diffie-Hellman combined with
        // our key to initialize the encryption ciphers.

        // Initialize the ciphers.
        EllSwiftPubKey ellswift(MakeByteSpan(m_recv_buffer));
        LOCK(m_send_mutex);
        m_cipher.Initialize(ellswift, m_initiating);

        // Switch receiver state to GARB_GARBTERM.
        SetReceiveState(RecvState::GARB_GARBTERM);
        m_recv_buffer.clear();

        // Switch sender state to READY.
        SetSendState(SendState::READY);

        // Append the garbage terminator to the send buffer.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
        std::copy(m_cipher.GetSendGarbageTerminator().begin(),
                  m_cipher.GetSendGarbageTerminator().end(),
                  MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::GARBAGE_TERMINATOR_LEN).begin());

        // Construct version packet in the send buffer, with the sent garbage data as AAD.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::EXPANSION + VERSION_CONTENTS.size());
        m_cipher.Encrypt(
            /*contents=*/VERSION_CONTENTS,
            /*aad=*/MakeByteSpan(m_send_garbage),
            /*ignore=*/false,
            /*output=*/MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::EXPANSION + VERSION_CONTENTS.size()));
        // We no longer need the garbage.
        ClearShrink(m_send_garbage);
    } else {
        // We still have to receive more key bytes.
    }
    return true;
}